

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fad<double> *pFVar9;
  FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
  *this_00;
  FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *pFVar10;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar11
  ;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar12
  ;
  FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *pFVar13;
  double *pdVar14;
  value_type vVar15;
  double dVar16;
  
  pFVar9 = (this->left_->fadexpr_).right_;
  this_00 = &this->right_->fadexpr_;
  pdVar14 = &pFVar9->defaultVal;
  if ((pFVar9->dx_).num_elts != 0) {
    pdVar14 = (pFVar9->dx_).ptr_to_data + i;
  }
  iVar6 = (this->left_->fadexpr_).left_.constant_;
  dVar1 = *pdVar14;
  pFVar10 = (this_00->left_->fadexpr_).left_;
  iVar7 = (pFVar10->fadexpr_).left_.constant_;
  dVar2 = ((pFVar10->fadexpr_).right_)->val_;
  dVar3 = ((this_00->left_->fadexpr_).right_)->val_;
  pFVar10 = (this_00->right_->fadexpr_).left_;
  iVar8 = (pFVar10->fadexpr_).left_.constant_;
  dVar4 = ((pFVar10->fadexpr_).right_)->val_;
  dVar5 = ((this_00->right_->fadexpr_).right_)->val_;
  vVar15 = FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
           ::dx(this_00,i);
  pFVar11 = (this->right_->fadexpr_).left_;
  pFVar10 = (pFVar11->fadexpr_).left_;
  pFVar12 = (this->right_->fadexpr_).right_;
  pFVar13 = (pFVar12->fadexpr_).left_;
  dVar16 = (((double)(pFVar13->fadexpr_).left_.constant_ - ((pFVar13->fadexpr_).right_)->val_) +
           ((pFVar12->fadexpr_).right_)->val_) *
           (((double)(pFVar10->fadexpr_).left_.constant_ - ((pFVar10->fadexpr_).right_)->val_) +
           ((pFVar11->fadexpr_).right_)->val_);
  return ((((double)iVar8 - dVar4) + dVar5) * (((double)iVar7 - dVar2) + dVar3) *
          (double)iVar6 * dVar1 -
         (double)(this->left_->fadexpr_).left_.constant_ * ((this->left_->fadexpr_).right_)->val_ *
         vVar15) / (dVar16 * dVar16);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}